

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_set_value.c
# Opt level: O0

int valueConvert(mpt_convertable *conv,mpt_type_t type,void *ptr)

{
  mpt_value *val_00;
  mpt_value *val;
  void *ptr_local;
  mpt_type_t type_local;
  mpt_convertable *conv_local;
  
  val_00 = (mpt_value *)conv[1]._vptr;
  if (type == 0) {
    if (ptr != (void *)0x0) {
      *(uint8_t **)ptr = "\x19";
    }
    conv_local._4_4_ = (int)val_00->_type;
  }
  else if (type == 0x19) {
    if (ptr != (void *)0x0) {
      *(void **)ptr = val_00->_addr;
      *(mpt_type_t *)((long)ptr + 8) = val_00->_type;
    }
    conv_local._4_4_ = 0x19;
  }
  else {
    conv_local._4_4_ = mpt_value_convert(val_00,type,ptr);
  }
  return conv_local._4_4_;
}

Assistant:

static int valueConvert(MPT_INTERFACE(convertable) *conv, MPT_TYPE(type) type, void *ptr)
{
	const MPT_STRUCT(value) *val = *((void **) (conv + 1));
	
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeValue), 0 };
		if (ptr) *((const uint8_t **) ptr) = fmt;
		return val->_type;
	}
	/* verbatim value assignment */
	if (type == MPT_ENUM(TypeValue)) {
		if (ptr) {
			memcpy(ptr, val, sizeof(*val));
		}
		return type;
	}
	return mpt_value_convert(val, type, ptr);
}